

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O0

int blech32_addr_decode(int *witver,uint8_t *witdata,size_t *witdata_len,char *hrp,char *addr)

{
  int iVar1;
  ulong local_820;
  size_t data_len;
  char hrp_actual [1000];
  byte local_428;
  uint8_t auStack_427 [7];
  uint8_t data [1000];
  char *addr_local;
  char *hrp_local;
  size_t *witdata_len_local;
  uint8_t *witdata_local;
  int *witver_local;
  
  iVar1 = blech32_decode((char *)&data_len,&local_428,&local_820,addr,1000);
  if ((((iVar1 != 0) && (local_820 != 0)) && (local_820 < 0x3e5)) &&
     ((iVar1 = strncmp(hrp,(char *)&data_len,0x3e3), iVar1 == 0 && (local_428 < 0x11)))) {
    *witdata_len = 0;
    iVar1 = blech32_convert_bits(witdata,witdata_len,8,auStack_427,local_820 - 1,5,0);
    if (((iVar1 != 0) && ((1 < *witdata_len && (*witdata_len < 0x42)))) &&
       ((local_428 != 0 || ((*witdata_len == 0x35 || (*witdata_len == 0x41)))))) {
      *witver = (uint)local_428;
      return 1;
    }
  }
  wally_clear_2(&local_428,1000,&data_len,1000);
  return 0;
}

Assistant:

static int blech32_addr_decode(int *witver, uint8_t *witdata, size_t *witdata_len, const char *hrp, const char *addr) {
    uint8_t data[WALLY_BLECH32_MAXLEN];
    char hrp_actual[WALLY_BLECH32_MAXLEN];
    size_t data_len;
    if (!blech32_decode(hrp_actual, data, &data_len, addr, WALLY_BLECH32_MAXLEN)) goto fail;
    if (data_len == 0 || data_len > (WALLY_BLECH32_MAXLEN - 4)) goto fail;
    if (strncmp(hrp, hrp_actual, WALLY_BLECH32_MAXLEN - 5) != 0) goto fail;
    if (data[0] > 16) goto fail;
    *witdata_len = 0;
    if (!blech32_convert_bits(witdata, witdata_len, 8, data + 1, data_len - 1, 5, 0)) goto fail;
    if (*witdata_len < 2 || *witdata_len > 65) goto fail;
    if (data[0] == 0 && *witdata_len != 53 && *witdata_len != 65) goto fail;
    *witver = data[0];
    return 1;
fail:
    wally_clear_2(data, sizeof(data), hrp_actual, sizeof(hrp_actual));
    return 0;
}